

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl_lite.cc
# Opt level: O2

void __thiscall
google::protobuf::io::ArrayOutputStream::ArrayOutputStream
          (ArrayOutputStream *this,void *data,int size,int block_size)

{
  (this->super_ZeroCopyOutputStream)._vptr_ZeroCopyOutputStream =
       (_func_int **)&PTR__ArrayOutputStream_00429d90;
  this->data_ = (uint8 *)data;
  this->size_ = size;
  if (0 < block_size) {
    size = block_size;
  }
  this->block_size_ = size;
  this->position_ = 0;
  this->last_returned_size_ = 0;
  return;
}

Assistant:

ArrayOutputStream::ArrayOutputStream(void* data, int size, int block_size)
  : data_(reinterpret_cast<uint8*>(data)),
    size_(size),
    block_size_(block_size > 0 ? block_size : size),
    position_(0),
    last_returned_size_(0) {
}